

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.hpp
# Opt level: O2

void __thiscall imgtogb::StdOutput::~StdOutput(StdOutput *this)

{
  ~StdOutput(this);
  operator_delete(this);
  return;
}

Assistant:

StdOutput(const std::string &basename, const std::string &author)
			: basename(basename)
			, author(author)
			{ }